

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
          (Matcher<fmt::v5::basic_string_view<wchar_t>_> *this,basic_string_view<wchar_t> value)

{
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> local_38;
  
  (this->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.value_ =
       (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)0x0;
  (this->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.link_.next_ =
       &(this->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.link_;
  (this->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d8008;
  local_38.value_ = (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)operator_new(0x18);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d81c8;
  local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value.data_;
  local_38.value_[2].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value.size_;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::
  operator=(&(this->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::
  ~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }